

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

TanhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_tanh(NeuralNetworkLayer *this)

{
  bool bVar1;
  TanhLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_tanh(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_tanh(this);
    this_00 = (TanhLayerParams *)operator_new(0x18);
    TanhLayerParams::TanhLayerParams(this_00);
    (this->layer_).tanh_ = this_00;
  }
  return (TanhLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::TanhLayerParams* NeuralNetworkLayer::mutable_tanh() {
  if (!has_tanh()) {
    clear_layer();
    set_has_tanh();
    layer_.tanh_ = new ::CoreML::Specification::TanhLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.tanh)
  return layer_.tanh_;
}